

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O1

int __thiscall
libtorrent::aux::mmap_storage::hash
          (mmap_storage *this,settings_interface *sett,hasher *ph,ptrdiff_t len,piece_index_t piece,
          int offset,open_mode_t mode,disk_job_flags_t flags,storage_error *error)

{
  file_index_t index;
  pointer psVar1;
  __pthread_internal_list *p_Var2;
  span<const_char> range;
  bool bVar3;
  char cVar4;
  open_mode_t mode_00;
  file_index_t fVar5;
  int iVar6;
  uint uVar7;
  int64_t iVar8;
  undefined8 uVar9;
  disk_job *pdVar10;
  int iVar11;
  mmap_storage *f;
  file_storage *pfVar12;
  storage_error *ec;
  disk_job *pdVar13;
  file_storage *this_00;
  disk_job *__new_size;
  span<const_char> range_00;
  span<const_char> data;
  span<char> buf;
  peer_request pVar14;
  shared_ptr<libtorrent::aux::file_mapping> handle;
  vector<char,_std::allocator<char>_> scratch;
  long local_b0;
  int local_a8;
  int local_a4;
  undefined1 local_90 [4];
  uint uStack_8c;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  __pthread_internal_list local_80;
  disk_job *local_70;
  undefined1 local_68 [40];
  sig local_40 [16];
  
  local_68._0_8_ = (char *)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  local_b0 = (long)offset + (long)this_00->m_piece_length * (long)piece.m_val;
  local_68._32_8_ = sett;
  mode_00.m_val = (uint)file_storage::file_index_at_offset(this_00,local_b0);
  iVar8 = file_storage::file_offset(this_00,(file_index_t)mode_00.m_val);
  local_b0 = local_b0 - iVar8;
  local_a8 = 0;
  do {
    if (len < 1) {
      local_a4 = local_a8;
      break;
    }
    iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
    iVar6 = (int)len;
    iVar11 = iVar6;
    if (iVar8 < local_b0 + iVar6) {
      iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      iVar11 = (int)iVar8 - (int)local_b0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
    }
    if (iVar11 == 0) {
      do {
        index.m_val = mode_00.m_val + 1;
        fVar5 = file_storage::end_file(this_00);
        if (fVar5.m_val <= index.m_val) {
          bVar3 = false;
          local_b0 = 0;
          local_a4 = local_a8;
          mode_00.m_val = index.m_val;
          goto LAB_002367f1;
        }
        iVar8 = file_storage::file_size(this_00,index);
        mode_00.m_val = mode_00.m_val + 1;
      } while (iVar8 == 0);
      iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      iVar11 = iVar6;
      if (iVar8 < iVar6) {
        iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
        iVar11 = (int)iVar8;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
      }
      local_b0 = 0;
    }
    pfVar12 = (this->m_mapped_files)._M_t.
              super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
              .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
    if (pfVar12 == (file_storage *)0x0) {
      pfVar12 = this->m_files;
    }
    bVar3 = file_storage::pad_file_at(pfVar12,(file_index_t)mode_00.m_val);
    __new_size = (disk_job *)(long)iVar11;
    if (bVar3) {
      iVar6 = hash_zeroes(ph,(int64_t)__new_size);
    }
    else {
      psVar1 = (this->m_file_priority).
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               .
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((((int)mode_00.m_val <
            *(int *)&(this->m_file_priority).
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
          (psVar1[(int)mode_00.m_val].m_val == '\0')) &&
         (bVar3 = use_partfile(this,(file_index_t)mode_00.m_val), bVar3)) {
        local_90 = (undefined1  [4])0x0;
        uStack_8c = uStack_8c & 0xffffff00;
        _Stack_88._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             &boost::system::detail::cat_holder<void>::system_category_instance;
        pfVar12 = (this->m_mapped_files)._M_t.
                  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
        if (pfVar12 == (file_storage *)0x0) {
          pfVar12 = this->m_files;
        }
        pVar14 = file_storage::map_file(pfVar12,(file_index_t)mode_00.m_val,local_b0,0);
        iVar6 = part_file::hash((this->m_part_file)._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::part_file_*,_std::default_delete<libtorrent::aux::part_file>_>
                                .super__Head_base<0UL,_libtorrent::aux::part_file_*,_false>.
                                _M_head_impl,ph,(ptrdiff_t)__new_size,pVar14.piece.m_val,
                                pVar14.start,(error_code *)local_90);
        if (uStack_8c._0_1_ == true) {
          (error->ec).val_ = (int)local_90;
          (error->ec).failed_ = (bool)(char)uStack_8c;
          *(int3 *)&(error->ec).field_0x5 = (int3)(uStack_8c >> 8);
          (error->ec).cat_ = (error_category *)_Stack_88._M_pi;
          error->operation = partfile_read;
          iVar6 = -1;
        }
      }
      else {
        f = this;
        ec = error;
        open_file((mmap_storage *)local_90,(settings_interface *)this,
                  (file_index_t)(int)local_68._32_8_,mode_00,(storage_error *)(ulong)mode.m_val);
        pdVar13 = (disk_job *)0xffffffff;
        if ((error->ec).val_ == 0) {
          local_70 = (disk_job *)CONCAT44(uStack_8c,local_90);
          p_Var2 = *(__pthread_internal_list **)&(local_70->error).field_0x10;
          if (p_Var2 == (__pthread_internal_list *)0x0) {
            ::std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)local_68,(size_type)__new_size);
            buf.m_ptr = (char *)(local_68._8_8_ + -local_68._0_8_);
            buf.m_len = local_b0;
            uVar7 = pread_all((aux *)(ulong)(uint)((file_handle *)&(local_70->error).ec.cat_)->m_fd,
                              (handle_type)local_68._0_8_,buf,(int64_t)error,&ec->ec);
            if ((error->ec).val_ == 0) {
              data.m_len = local_68._8_8_ - local_68._0_8_;
              data.m_ptr = (char *)local_68._0_8_;
              lcrypto::hasher::update(ph,data);
              pdVar13 = (disk_job *)(ulong)uVar7;
            }
          }
          else {
            local_80.__next = *(__pthread_internal_list **)&(local_70->error).ec;
            pdVar13 = (disk_job *)0x0;
            pdVar10 = (disk_job *)((long)local_80.__next - local_b0);
            local_80.__prev = p_Var2;
            if (pdVar10 != (disk_job *)0x0 && local_b0 <= (long)local_80.__next) {
              local_80.__next = (__pthread_internal_list *)__new_size;
              if ((long)pdVar10 < (long)__new_size) {
                local_80.__next = (__pthread_internal_list *)pdVar10;
              }
              local_80.__prev = (__pthread_internal_list *)((long)&p_Var2->__prev + local_b0);
              local_40._8_8_ = &local_80;
              local_40._0_8_ = ph;
              sig::operator()(local_40,(anon_class_16_2_14dc695b *)f);
              pdVar13 = (disk_job *)local_80.__next;
              if ((flags.m_val & 0x10) != 0) {
                range_00.m_len = (difference_type)local_80.__next;
                range_00.m_ptr = (char *)local_80.__prev;
                file_mapping::dont_need((file_mapping *)local_70,range_00);
              }
              if ((char)flags.m_val < '\0') {
                range.m_len = (difference_type)local_80.__next;
                range.m_ptr = (char *)local_80.__prev;
                file_mapping::page_out((file_mapping *)local_70,range);
              }
            }
          }
        }
        iVar6 = (int)pdVar13;
        if (_Stack_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_88._M_pi);
        }
      }
    }
    bVar3 = (error->ec).val_ == 0;
    if (bVar3) {
      len = len - iVar6;
      local_b0 = local_b0 + iVar6;
      local_a8 = local_a8 + iVar6;
      if ((0 < iVar11) && (iVar6 == 0)) {
        error->operation = file_read;
        uVar9 = 0x100000002;
        if ((DAT_004fcee8 != -0x70502de1da3a1f65) &&
           (uVar9 = 0x100000002, DAT_004fcee8 != -0x4d54ee85da8120f3)) {
          cVar4 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2);
          uVar9 = 2;
          if (cVar4 != '\0') {
            uVar9 = 0x100000002;
          }
        }
        (error->ec).val_ = (int)uVar9;
        (error->ec).failed_ = (bool)(char)((ulong)uVar9 >> 0x20);
        *(int3 *)&(error->ec).field_0x5 = (int3)((ulong)uVar9 >> 0x28);
        (error->ec).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
        goto LAB_002367dd;
      }
      bVar3 = true;
    }
    else {
      local_a4 = local_a8;
LAB_002367dd:
      *(short *)&error->field_0x10 = (short)mode_00.m_val;
      error->field_0x12 = (char)(mode_00.m_val >> 0x10);
    }
LAB_002367f1:
  } while (bVar3);
  if ((char *)local_68._0_8_ != (char *)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  return local_a4;
}

Assistant:

int mmap_storage::hash(settings_interface const& sett
		, hasher& ph, std::ptrdiff_t const len
		, piece_index_t const piece, int const offset
		, aux::open_mode_t const mode
		, disk_job_flags_t const flags
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_READ
		std::this_thread::sleep_for(milliseconds(rand() % 2000));
#endif

		char dummy;
		std::vector<char> scratch;

		return readwrite(files(), span<char const>{&dummy, len}, piece, offset, error
			, [this, mode, flags, &ph, &sett, &scratch](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> const buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
				return aux::hash_zeroes(ph, buf.size());

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				error_code e;
				peer_request map = files().map_file(file_index, file_offset, 0);
				int const ret = m_part_file->hash(ph, buf.size()
					, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_read;
					return -1;
				}
				return ret;
			}

			auto handle = open_file(sett, file_index, mode, ec);
			if (ec) return -1;

			if (!handle->has_memory_map())
			{
				scratch.resize(std::size_t(buf.size()));
				int const ret = aux::pread_all(handle->fd(), scratch, file_offset, ec.ec);
				if (ec) return -1;
				ph.update(scratch);
				return ret;
			}

			int ret = 0;
			span<byte const> file_range = handle->range();
			if (file_range.size() > file_offset)
			{
				file_range = file_range.subspan(std::ptrdiff_t(file_offset)
					, std::min(buf.size(), std::ptrdiff_t(file_range.size() - file_offset)));

				sig::try_signal([&]{
					ph.update({const_cast<char const*>(file_range.data()), file_range.size()});
				});
				ret += static_cast<int>(file_range.size());
				if (flags & disk_interface::volatile_read)
					handle->dont_need(file_range);
				if (flags & disk_interface::flush_piece)
					handle->page_out(file_range);
			}

			return ret;
		});
	}